

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_nodecount_unretained(mpc_parser_t *p,int force)

{
  int iVar1;
  int local_24;
  int local_20;
  int total;
  int i;
  int force_local;
  mpc_parser_t *p_local;
  
  if ((p->retained == '\0') || (force != 0)) {
    if (p->type == '\x05') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x0f') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x10') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x11') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x19') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x1a') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x12') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x13') {
      iVar1 = mpc_nodecount_unretained((p->data).expect.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x14') {
      iVar1 = mpc_nodecount_unretained((p->data).repeat.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x15') {
      iVar1 = mpc_nodecount_unretained((p->data).repeat.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x16') {
      iVar1 = mpc_nodecount_unretained((p->data).repeat.x,0);
      p_local._4_4_ = iVar1 + 1;
    }
    else if (p->type == '\x17') {
      local_24 = 1;
      for (local_20 = 0; local_20 < (p->data).repeat.n; local_20 = local_20 + 1) {
        iVar1 = mpc_nodecount_unretained
                          (*(mpc_parser_t **)((long)(p->data).lift.x + (long)local_20 * 8),0);
        local_24 = iVar1 + local_24;
      }
      p_local._4_4_ = local_24;
    }
    else if (p->type == '\x18') {
      local_24 = 1;
      for (local_20 = 0; local_20 < (p->data).repeat.n; local_20 = local_20 + 1) {
        iVar1 = mpc_nodecount_unretained
                          (*(mpc_parser_t **)((long)(p->data).apply_to.d + (long)local_20 * 8),0);
        local_24 = iVar1 + local_24;
      }
      p_local._4_4_ = local_24;
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int mpc_nodecount_unretained(mpc_parser_t* p, int force) {

  int i, total;

  if (p->retained && !force) { return 0; }

  if (p->type == MPC_TYPE_EXPECT) { return 1 + mpc_nodecount_unretained(p->data.expect.x, 0); }

  if (p->type == MPC_TYPE_APPLY)    { return 1 + mpc_nodecount_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO) { return 1 + mpc_nodecount_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)  { return 1 + mpc_nodecount_unretained(p->data.predict.x, 0); }

  if (p->type == MPC_TYPE_CHECK)    { return 1 + mpc_nodecount_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { return 1 + mpc_nodecount_unretained(p->data.check_with.x, 0); }

  if (p->type == MPC_TYPE_NOT)   { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE) { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }

  if (p->type == MPC_TYPE_MANY)  { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    total = 1;
    for(i = 0; i < p->data.or.n; i++) {
      total += mpc_nodecount_unretained(p->data.or.xs[i], 0);
    }
    return total;
  }

  if (p->type == MPC_TYPE_AND) {
    total = 1;
    for(i = 0; i < p->data.and.n; i++) {
      total += mpc_nodecount_unretained(p->data.and.xs[i], 0);
    }
    return total;
  }

  return 1;

}